

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_4495f9::ECCurveTest_GenerateFIPS_Test::TestBody
          (ECCurveTest_GenerateFIPS_Test *this)

{
  int iVar1;
  ParamType_conflict *pPVar2;
  char *in_R9;
  AssertHelper AStack_58;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_50;
  UniquePtr<EC_KEY> key;
  string local_40;
  AssertionResult gtest_ar_;
  
  pPVar2 = testing::WithParamInterface<int>::GetParam();
  key._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl =
       (__uniq_ptr_data<ec_key_st,_bssl::internal::Deleter,_true,_true>)
       EC_KEY_new_by_curve_name(*pPVar2);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ =
       (tuple<ec_key_st_*,_bssl::internal::Deleter>)
       key._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
       super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
       super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl !=
       (_Head_base<0UL,_ec_key_st_*,_false>)0x0;
  if ((tuple<ec_key_st_*,_bssl::internal::Deleter>)
      key._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
      super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
      super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl ==
      (_Head_base<0UL,_ec_key_st_*,_false>)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_40,(internal *)&gtest_ar_,(AssertionResult *)0x55f7b2,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
               ,0x29d,local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
  }
  else {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    iVar1 = EC_KEY_generate_key_fips
                      ((EC_KEY *)
                       key._M_t.super___uniq_ptr_impl<ec_key_st,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_ec_key_st_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_ec_key_st_*,_false>._M_head_impl);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    gtest_ar_.success_ = iVar1 != 0;
    if (gtest_ar_.success_) goto LAB_0029e14d;
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_40,(internal *)&gtest_ar_,
               (AssertionResult *)"EC_KEY_generate_key_fips(key.get())","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
               ,0x29e,local_40._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_58,(Message *)&local_50);
  }
  testing::internal::AssertHelper::~AssertHelper(&AStack_58);
  std::__cxx11::string::~string((string *)&local_40);
  if (local_50._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_50._M_head_impl + 8))();
  }
LAB_0029e14d:
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  std::unique_ptr<ec_key_st,_bssl::internal::Deleter>::~unique_ptr(&key);
  return;
}

Assistant:

TEST_P(ECCurveTest, GenerateFIPS) {
  // Generate an EC_KEY.
  bssl::UniquePtr<EC_KEY> key(EC_KEY_new_by_curve_name(GetParam()));
  ASSERT_TRUE(key);
  ASSERT_TRUE(EC_KEY_generate_key_fips(key.get()));
}